

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void iidentity32_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  
  lVar6 = 0xf0;
  for (uVar8 = 0; uVar8 < 0x20; uVar8 = uVar8 + 0x10) {
    piVar1 = (int *)((long)in[-0xf] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-0xf] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-0xe] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-0xe] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-0xd] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-0xd] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-0xc] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-0xc] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-0xb] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-0xb] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-10] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-10] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-9] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-9] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-8] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-8] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-7] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-7] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-6] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-6] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-5] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-5] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-4] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-4] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-3] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-3] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-2] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-2] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)in[-1] + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)out[-1] + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    piVar1 = (int *)((long)*in + lVar6);
    iVar5 = piVar1[1];
    iVar3 = piVar1[2];
    iVar4 = piVar1[3];
    piVar2 = (int *)((long)*out + lVar6);
    *piVar2 = *piVar1 << 2;
    piVar2[1] = iVar5 << 2;
    piVar2[2] = iVar3 << 2;
    piVar2[3] = iVar4 << 2;
    lVar6 = lVar6 + 0x100;
  }
  if (do_cols == 0) {
    bVar7 = 10;
    if (10 < bd) {
      bVar7 = (byte)bd;
    }
    iVar5 = 0x20 << (bVar7 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar5;
    clamp_hi_out[0]._0_4_ = iVar5 + -1;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    round_shift_8x8(out,out_shift);
    round_shift_8x8(out + 0x10,out_shift);
    highbd_clamp_epi32_sse4_1(out,out,&clamp_lo_out,&clamp_hi_out,0x20);
  }
  return;
}

Assistant:

static void iidentity32_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  (void)bit;
  for (int i = 0; i < 32; i += 16) {
    out[i] = _mm_slli_epi32(in[i], 2);
    out[i + 1] = _mm_slli_epi32(in[i + 1], 2);
    out[i + 2] = _mm_slli_epi32(in[i + 2], 2);
    out[i + 3] = _mm_slli_epi32(in[i + 3], 2);
    out[i + 4] = _mm_slli_epi32(in[i + 4], 2);
    out[i + 5] = _mm_slli_epi32(in[i + 5], 2);
    out[i + 6] = _mm_slli_epi32(in[i + 6], 2);
    out[i + 7] = _mm_slli_epi32(in[i + 7], 2);
    out[i + 8] = _mm_slli_epi32(in[i + 8], 2);
    out[i + 9] = _mm_slli_epi32(in[i + 9], 2);
    out[i + 10] = _mm_slli_epi32(in[i + 10], 2);
    out[i + 11] = _mm_slli_epi32(in[i + 11], 2);
    out[i + 12] = _mm_slli_epi32(in[i + 12], 2);
    out[i + 13] = _mm_slli_epi32(in[i + 13], 2);
    out[i + 14] = _mm_slli_epi32(in[i + 14], 2);
    out[i + 15] = _mm_slli_epi32(in[i + 15], 2);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8(out, out_shift);
    round_shift_8x8(out + 16, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 32);
  }
}